

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timetrans.cpp
# Opt level: O2

bool BDST2GPST(SATTIME bdst,SATTIME *gpst)

{
  double dVar1;
  
  gpst->Week = bdst.Week + 0x54c;
  dVar1 = bdst.SOW + 14.0;
  gpst->SOW = dVar1;
  if (604800.0 <= dVar1) {
    gpst->SOW = dVar1 + -604800.0;
    gpst->Week = bdst.Week + 0x54d;
  }
  return true;
}

Assistant:

bool BDST2GPST(const SATTIME bdst, SATTIME &gpst)
{
    gpst.Week = bdst.Week + 1356;
    gpst.SOW = bdst.SOW + 14;
    if(gpst.SOW >= 604800 )
    {
        gpst.SOW -= 604800;
        gpst.Week += 1;
    }
    return true;
}